

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O3

void __thiscall capnp::_::ReaderArena::~ReaderArena(ReaderArena *this)

{
  anon_union_72_1_a8c68091_for_NullableValue<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>_>_2
  *paVar1;
  HashBucket *pHVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  Entry *pEVar5;
  RemoveConst<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry> *pRVar6;
  Entry *pEVar7;
  
  if ((this->moreSegments).value.ptr.isSet == true) {
    pHVar2 = (this->moreSegments).value.ptr.field_1.value.table.indexes.buckets.ptr;
    if (pHVar2 != (HashBucket *)0x0) {
      sVar3 = (this->moreSegments).value.ptr.field_1.value.table.indexes.buckets.size_;
      (this->moreSegments).value.ptr.field_1.value.table.indexes.buckets.ptr = (HashBucket *)0x0;
      (this->moreSegments).value.ptr.field_1.value.table.indexes.buckets.size_ = 0;
      pAVar4 = (this->moreSegments).value.ptr.field_1.value.table.indexes.buckets.disposer;
      (**pAVar4->_vptr_ArrayDisposer)(pAVar4,pHVar2,8,sVar3,sVar3,0);
    }
    paVar1 = &(this->moreSegments).value.ptr.field_1;
    pEVar5 = (paVar1->value).table.rows.builder.ptr;
    if (pEVar5 != (Entry *)0x0) {
      pRVar6 = (this->moreSegments).value.ptr.field_1.value.table.rows.builder.pos;
      pEVar7 = (this->moreSegments).value.ptr.field_1.value.table.rows.builder.endPtr;
      (paVar1->value).table.rows.builder.ptr = (Entry *)0x0;
      (this->moreSegments).value.ptr.field_1.value.table.rows.builder.pos =
           (RemoveConst<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry> *)0x0;
      (this->moreSegments).value.ptr.field_1.value.table.rows.builder.endPtr = (Entry *)0x0;
      pAVar4 = (this->moreSegments).value.ptr.field_1.value.table.rows.builder.disposer;
      (**pAVar4->_vptr_ArrayDisposer)
                (pAVar4,pEVar5,0x18,((long)pRVar6 - (long)pEVar5 >> 3) * -0x5555555555555555,
                 ((long)pEVar7 - (long)pEVar5 >> 3) * -0x5555555555555555,
                 kj::ArrayDisposer::
                 Dispose_<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader,_std::nullptr_t>_>::Entry>
                 ::destruct);
    }
  }
  kj::_::Mutex::~Mutex(&(this->moreSegments).mutex);
  return;
}

Assistant:

ReaderArena::~ReaderArena() noexcept(false) {}